

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PPointer * NewPointer(PType *type,bool isconst)

{
  PClass *len;
  PPointer *local_28;
  PType *ptype;
  size_t bucket;
  PType *pPStack_10;
  bool isconst_local;
  PType *type_local;
  
  len = PPointer::RegistrationInfo.MyClass;
  bucket._7_1_ = isconst;
  pPStack_10 = type;
  local_28 = (PPointer *)
             FTypeTable::FindType
                       (&TypeTable,PPointer::RegistrationInfo.MyClass,(intptr_t)type,
                        (long)(int)(uint)isconst,(size_t *)&ptype);
  if (local_28 == (PPointer *)0x0) {
    local_28 = (PPointer *)DObject::operator_new((DObject *)0xa8,(size_t)len);
    PPointer::PPointer(local_28,pPStack_10,(bool)(bucket._7_1_ & 1));
    FTypeTable::AddType(&TypeTable,(PType *)local_28,PPointer::RegistrationInfo.MyClass,
                        (intptr_t)pPStack_10,(long)(int)(uint)((bucket._7_1_ & 1) != 0),
                        (size_t)ptype);
  }
  return local_28;
}

Assistant:

PPointer *NewPointer(PType *type, bool isconst)
{
	size_t bucket;
	PType *ptype = TypeTable.FindType(RUNTIME_CLASS(PPointer), (intptr_t)type, isconst ? 1 : 0, &bucket);
	if (ptype == NULL)
	{
		ptype = new PPointer(type, isconst);
		TypeTable.AddType(ptype, RUNTIME_CLASS(PPointer), (intptr_t)type, isconst ? 1 : 0, bucket);
	}
	return static_cast<PPointer *>(ptype);
}